

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

Locale * __thiscall
icu_63::RuleBasedNumberFormat::getRuleSetDisplayNameLocale
          (Locale *__return_storage_ptr__,RuleBasedNumberFormat *this,int32_t index,
          UErrorCode *status)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 extraout_var;
  char *target;
  int32_t length;
  UnicodeString name;
  char buffer [64];
  ConstChar16Ptr local_c0;
  char16_t *local_b8;
  UnicodeString local_a8;
  char local_68 [72];
  
  if (U_ZERO_ERROR < *status) {
    Locale::Locale(__return_storage_ptr__,"",(char *)0x0,(char *)0x0,(char *)0x0);
    return __return_storage_ptr__;
  }
  if ((index < 0 || this->localizations == (LocalizationInfo *)0x0) ||
     (iVar2 = (*this->localizations->_vptr_LocalizationInfo[5])(), iVar2 <= index)) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    Locale::Locale(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  iVar2 = (*this->localizations->_vptr_LocalizationInfo[6])(this->localizations,(ulong)(uint)index);
  local_c0.p_ = (char16_t *)CONCAT44(extraout_var,iVar2);
  UnicodeString::UnicodeString(&local_a8,'\x01',&local_c0,-1);
  local_b8 = local_c0.p_;
  length = (int)local_a8.fUnion.fStackFields.fLengthAndFlags >> 5;
  uVar1 = length;
  if (local_a8.fUnion.fStackFields.fLengthAndFlags < 0) {
    uVar1 = local_a8.fUnion.fFields.fLength;
  }
  if ((int)uVar1 < 0x40) {
    target = local_68;
  }
  else {
    target = (char *)uprv_malloc_63((ulong)(uVar1 + 1));
    if (target == (char *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      Locale::Locale(__return_storage_ptr__,"",(char *)0x0,(char *)0x0,(char *)0x0);
      goto LAB_00215534;
    }
    length = (int)local_a8.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if (local_a8.fUnion.fStackFields.fLengthAndFlags < 0) {
    length = local_a8.fUnion.fFields.fLength;
  }
  UnicodeString::extract(&local_a8,0,length,target,uVar1 + 1,kInvariant);
  Locale::Locale(__return_storage_ptr__,target,(char *)0x0,(char *)0x0,(char *)0x0);
  if (target != local_68) {
    uprv_free_63(target);
  }
LAB_00215534:
  UnicodeString::~UnicodeString(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

Locale 
RuleBasedNumberFormat::getRuleSetDisplayNameLocale(int32_t index, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return Locale("");
    }
    if (localizations && index >= 0 && index < localizations->getNumberOfDisplayLocales()) {
        UnicodeString name(TRUE, localizations->getLocaleName(index), -1);
        char buffer[64];
        int32_t cap = name.length() + 1;
        char* bp = buffer;
        if (cap > 64) {
            bp = (char *)uprv_malloc(cap);
            if (bp == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return Locale("");
            }
        }
        name.extract(0, name.length(), bp, cap, UnicodeString::kInvariant);
        Locale retLocale(bp);
        if (bp != buffer) {
            uprv_free(bp);
        }
        return retLocale;
    }
    status = U_ILLEGAL_ARGUMENT_ERROR;
    Locale retLocale;
    return retLocale;
}